

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O2

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_a = (int64_t)status;
  if (eval_a == 0) {
    iVar1 = uv_tcp_init(server->loop,&connection);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_accept(server,(uv_stream_t *)&connection);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_read_start((uv_stream_t *)&connection,on_alloc,on_read1);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          return;
        }
        pcVar2 = "uv_read_start((uv_stream_t*)&connection, on_alloc, on_read1)";
        uVar3 = 0x5f;
      }
      else {
        pcVar2 = "uv_accept(server, (uv_stream_t* )&connection)";
        uVar3 = 0x5d;
      }
    }
    else {
      pcVar2 = "uv_tcp_init(server->loop, &connection)";
      uVar3 = 0x5b;
    }
  }
  else {
    pcVar2 = "status";
    uVar3 = 0x59;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop-start.c"
          ,uVar3,pcVar2,"==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_tcp_t* handle;
  int r;

  ASSERT_OK(status);

  handle = malloc(sizeof(*handle));
  ASSERT_NOT_NULL(handle);

  r = uv_tcp_init_ex(server->loop, handle, AF_INET);
  ASSERT_OK(r);

  r = uv_accept(server, (uv_stream_t*)handle);
  ASSERT_EQ(r, UV_EBUSY);

  uv_close((uv_handle_t*) server, NULL);
  uv_close((uv_handle_t*) handle, (uv_close_cb)free);
}